

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

sunrealtype cvQuadSensNorm(CVodeMem cv_mem,N_Vector *xQS,N_Vector *wQS)

{
  long lVar1;
  sunrealtype sVar2;
  sunrealtype sVar3;
  
  N_VWrmsNormVectorArray(cv_mem->cv_Ns,xQS,wQS,cv_mem->cv_cvals);
  sVar2 = *cv_mem->cv_cvals;
  if (1 < (long)cv_mem->cv_Ns) {
    lVar1 = 1;
    sVar3 = sVar2;
    do {
      sVar2 = cv_mem->cv_cvals[lVar1];
      if (sVar2 <= sVar3) {
        sVar2 = sVar3;
      }
      lVar1 = lVar1 + 1;
      sVar3 = sVar2;
    } while (cv_mem->cv_Ns != lVar1);
  }
  return sVar2;
}

Assistant:

static sunrealtype cvQuadSensNorm(CVodeMem cv_mem, N_Vector* xQS, N_Vector* wQS)
{
  int is;
  sunrealtype nrm;

  (void)N_VWrmsNormVectorArray(cv_mem->cv_Ns, xQS, wQS, cv_mem->cv_cvals);

  nrm = cv_mem->cv_cvals[0];
  for (is = 1; is < cv_mem->cv_Ns; is++)
  {
    if (cv_mem->cv_cvals[is] > nrm) { nrm = cv_mem->cv_cvals[is]; }
  }

  return (nrm);
}